

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O0

void array_suite::test_integer_many(void)

{
  undefined4 local_32c;
  size_type local_328;
  undefined4 local_31c;
  value local_318;
  undefined1 local_313;
  undefined1 local_312 [2];
  view_type local_310;
  view_type local_2f8;
  undefined4 local_2e4;
  size_type local_2e0;
  undefined4 local_2d4;
  value local_2d0;
  undefined1 local_2cb;
  undefined1 local_2ca [2];
  view_type local_2c8;
  view_type local_2b0;
  undefined4 local_29c;
  size_type local_298 [2];
  undefined4 local_288;
  int local_284 [2];
  undefined4 local_27c;
  value local_278;
  undefined1 local_273;
  undefined1 local_272 [2];
  view_type local_270;
  view_type local_258;
  undefined4 local_244;
  size_type local_240 [2];
  undefined4 local_230;
  int local_22c [2];
  undefined4 local_224;
  value local_220;
  undefined1 local_21b;
  undefined1 local_21a [2];
  view_type local_218;
  view_type local_200;
  undefined4 local_1ec;
  size_type local_1e8 [2];
  undefined4 local_1d8;
  int local_1d4 [2];
  undefined4 local_1cc;
  value local_1c8;
  undefined1 local_1c3;
  undefined1 local_1c2 [2];
  view_type local_1c0;
  view_type local_1a8;
  undefined4 local_194;
  size_type local_190 [3];
  undefined4 local_174;
  value local_170 [2];
  basic_string_view<char,_std::char_traits<char>_> local_168;
  undefined1 local_158 [8];
  reader reader;
  char input [8];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x5d332c322c315b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_168,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_158,&local_168);
  local_170[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_174 = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x14e,"void array_suite::test_integer_many()",local_170,&local_174);
  local_190[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_158);
  local_194 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x14f,"void array_suite::test_integer_many()",local_190,&local_194);
  local_1a8 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"[\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x150,"void array_suite::test_integer_many()",&local_1a8,"[");
  local_1c0 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[7]>
            ("reader.tail()","\"1,2,3]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x151,"void array_suite::test_integer_many()",&local_1c0,"1,2,3]");
  local_1c2[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_1c3 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x153,"void array_suite::test_integer_many()",local_1c2,&local_1c3);
  local_1c8 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_1cc = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x154,"void array_suite::test_integer_many()",&local_1c8,&local_1cc);
  local_1d4[0] = trial::protocol::json::basic_reader<char>::value<int>
                           ((basic_reader<char> *)local_158);
  local_1d8 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x155,"void array_suite::test_integer_many()",local_1d4,&local_1d8);
  local_1e8[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_158);
  local_1ec = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x156,"void array_suite::test_integer_many()",local_1e8,&local_1ec);
  local_200 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"1\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x157,"void array_suite::test_integer_many()",&local_200,"1");
  local_218 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[6]>
            ("reader.tail()","\",2,3]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x158,"void array_suite::test_integer_many()",&local_218,",2,3]");
  local_21a[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_21b = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x15a,"void array_suite::test_integer_many()",local_21a,&local_21b);
  local_220 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_224 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x15b,"void array_suite::test_integer_many()",&local_220,&local_224);
  local_22c[0] = trial::protocol::json::basic_reader<char>::value<int>
                           ((basic_reader<char> *)local_158);
  local_230 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x15c,"void array_suite::test_integer_many()",local_22c,&local_230);
  local_240[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_158);
  local_244 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x15d,"void array_suite::test_integer_many()",local_240,&local_244);
  local_258 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"2\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x15e,"void array_suite::test_integer_many()",&local_258,"2");
  local_270 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[4]>
            ("reader.tail()","\",3]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x15f,"void array_suite::test_integer_many()",&local_270,",3]");
  local_272[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_273 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x161,"void array_suite::test_integer_many()",local_272,&local_273);
  local_278 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_27c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x162,"void array_suite::test_integer_many()",&local_278,&local_27c);
  local_284[0] = trial::protocol::json::basic_reader<char>::value<int>
                           ((basic_reader<char> *)local_158);
  local_288 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("reader.value<int>()","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x163,"void array_suite::test_integer_many()",local_284,&local_288);
  local_298[0] = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_158);
  local_29c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x164,"void array_suite::test_integer_many()",local_298,&local_29c);
  local_2b0 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"3\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x165,"void array_suite::test_integer_many()",&local_2b0,"3");
  local_2c8 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.tail()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x166,"void array_suite::test_integer_many()",&local_2c8,"]");
  local_2ca[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_2cb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x168,"void array_suite::test_integer_many()",local_2ca,&local_2cb);
  local_2d0 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_2d4 = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x169,"void array_suite::test_integer_many()",&local_2d0,&local_2d4);
  local_2e0 = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_158);
  local_2e4 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x16a,"void array_suite::test_integer_many()",&local_2e0,&local_2e4);
  local_2f8 = trial::protocol::json::basic_reader<char>::literal((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[2]>
            ("reader.literal()","\"]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x16b,"void array_suite::test_integer_many()",&local_2f8,"]");
  local_310 = trial::protocol::json::basic_reader<char>::tail((basic_reader<char> *)local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[1]>
            ("reader.tail()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x16c,"void array_suite::test_integer_many()",&local_310,"");
  local_312[0] = trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_158);
  local_313 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x16e,"void array_suite::test_integer_many()",local_312,&local_313);
  local_318 = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_158);
  local_31c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x16f,"void array_suite::test_integer_many()",&local_318,&local_31c);
  local_328 = trial::protocol::json::basic_reader<char>::level((basic_reader<char> *)local_158);
  local_32c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x170,"void array_suite::test_integer_many()",&local_328,&local_32c);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_158);
  return;
}

Assistant:

void test_integer_many()
{
    const char input[] = "[1,2,3]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "[");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "1,2,3]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "1");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), ",2,3]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "2");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), ",3]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<int>(), 3);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "3");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "]");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "]");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.tail(), "");

    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 0);
}